

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::keyToIdx<std::__cxx11::string_const&>
          (Table<true,80ul,std::__cxx11::string,std::function<void(Rml::DataModelHandle,Rml::Event&,std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,size_t *idx,
          InfoType *info)

{
  size_t sVar1;
  size_t local_40;
  identity_hash<unsigned_long> local_31 [9];
  size_t h;
  InfoType *info_local;
  size_t *idx_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  h = (size_t)info;
  info_local = (InfoType *)idx;
  idx_local = (size_t *)key;
  key_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_40 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)this,key);
  sVar1 = identity_hash<unsigned_long>::operator()(local_31,&local_40);
  *(int *)h = *(int *)(this + 0x28) +
              (int)((sVar1 & 0x1f) >> ((byte)*(undefined4 *)(this + 0x2c) & 0x3f));
  *(size_t *)info_local = sVar1 >> 5 & *(ulong *)(this + 0x18);
  return;
}

Assistant:

void keyToIdx(HashKey&& key, size_t* idx, InfoType* info) const {
        // for a user-specified hash that is *not* robin_hood::hash, apply robin_hood::hash as
        // an additional mixing step. This serves as a bad hash prevention, if the given data is
        // badly mixed.
        using Mix =
            typename std::conditional<std::is_same<::robin_hood::hash<key_type>, hasher>::value,
                                      ::robin_hood::detail::identity_hash<size_t>,
                                      ::robin_hood::hash<size_t>>::type;

        // the lower InitialInfoNumBits are reserved for info.
        auto h = Mix{}(WHash::operator()(key));
        *info = mInfoInc + static_cast<InfoType>((h & InfoMask) >> mInfoHashShift);
        *idx = (h >> InitialInfoNumBits) & mMask;
    }